

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O1

int cuddZddLinearBackward(DdManager *table,int size,Move *moves)

{
  Move **ppMVar1;
  int iVar2;
  Move *pMVar3;
  
  pMVar3 = moves;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar3->size < size) {
        size = pMVar3->size;
      }
      ppMVar1 = &pMVar3->next;
      pMVar3 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
  }
  if (moves != (Move *)0x0) {
    do {
      if (moves->size == size) {
        return 1;
      }
      if ((moves->flags == 1) && (iVar2 = cuddZddLinearInPlace(table,moves->x,moves->y), iVar2 == 0)
         ) {
        return 0;
      }
      iVar2 = cuddZddSwapInPlace(table,moves->x,moves->y);
      if (iVar2 == 0) {
        return 0;
      }
      if ((moves->flags == 2) && (iVar2 = cuddZddLinearInPlace(table,moves->x,moves->y), iVar2 == 0)
         ) {
        return 0;
      }
      moves = moves->next;
    } while (moves != (Move *)0x0);
  }
  return 1;
}

Assistant:

static int
cuddZddLinearBackward(
  DdManager * table,
  int  size,
  Move * moves)
{
    Move        *move;
    int         res;

    /* Find the minimum size among moves. */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        if (move->flags == CUDD_LINEAR_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
        res = cuddZddSwapInPlace(table, move->x, move->y);
        if (!res)
            return(0);
        if (move->flags == CUDD_INVERSE_TRANSFORM_MOVE) {
            res = cuddZddLinearInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
        }
    }

    return(1);

}